

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StyleSheet.cpp
# Opt level: O2

UniquePtr<StyleSheet> __thiscall
Rml::StyleSheet::CombineStyleSheet(StyleSheet *this,StyleSheet *other_sheet)

{
  unique_ptr<Rml::StyleSheetNode,_std::default_delete<Rml::StyleSheetNode>_> __p;
  _Head_base<0UL,_Rml::StyleSheetNode_*,_false> this_00;
  StyleSheet *in_RDX;
  _Head_base<0UL,_Rml::StyleSheetNode_*,_false> local_30;
  
  this_00._M_head_impl = (StyleSheetNode *)operator_new(0x1c0);
  StyleSheet((StyleSheet *)this_00._M_head_impl);
  (this->root)._M_t.
  super___uniq_ptr_impl<Rml::StyleSheetNode,_std::default_delete<Rml::StyleSheetNode>_>._M_t.
  super__Tuple_impl<0UL,_Rml::StyleSheetNode_*,_std::default_delete<Rml::StyleSheetNode>_>.
  super__Head_base<0UL,_Rml::StyleSheetNode_*,_false>._M_head_impl = this_00._M_head_impl;
  StyleSheetNode::DeepCopy
            ((StyleSheetNode *)&stack0xffffffffffffffd0,
             (other_sheet->root)._M_t.
             super___uniq_ptr_impl<Rml::StyleSheetNode,_std::default_delete<Rml::StyleSheetNode>_>.
             _M_t.
             super__Tuple_impl<0UL,_Rml::StyleSheetNode_*,_std::default_delete<Rml::StyleSheetNode>_>
             .super__Head_base<0UL,_Rml::StyleSheetNode_*,_false>._M_head_impl);
  __p._M_t.super___uniq_ptr_impl<Rml::StyleSheetNode,_std::default_delete<Rml::StyleSheetNode>_>.
  _M_t.super__Tuple_impl<0UL,_Rml::StyleSheetNode_*,_std::default_delete<Rml::StyleSheetNode>_>.
  super__Head_base<0UL,_Rml::StyleSheetNode_*,_false>._M_head_impl =
       (__uniq_ptr_data<Rml::StyleSheetNode,_std::default_delete<Rml::StyleSheetNode>,_true,_true>)
       (__uniq_ptr_data<Rml::StyleSheetNode,_std::default_delete<Rml::StyleSheetNode>,_true,_true>)
       local_30._M_head_impl;
  local_30._M_head_impl = (StyleSheetNode *)0x0;
  ::std::__uniq_ptr_impl<Rml::StyleSheetNode,_std::default_delete<Rml::StyleSheetNode>_>::reset
            ((__uniq_ptr_impl<Rml::StyleSheetNode,_std::default_delete<Rml::StyleSheetNode>_> *)
             this_00._M_head_impl,
             (pointer)__p._M_t.
                      super___uniq_ptr_impl<Rml::StyleSheetNode,_std::default_delete<Rml::StyleSheetNode>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_Rml::StyleSheetNode_*,_std::default_delete<Rml::StyleSheetNode>_>
                      .super__Head_base<0UL,_Rml::StyleSheetNode_*,_false>._M_head_impl);
  ::std::unique_ptr<Rml::StyleSheetNode,_std::default_delete<Rml::StyleSheetNode>_>::~unique_ptr
            ((unique_ptr<Rml::StyleSheetNode,_std::default_delete<Rml::StyleSheetNode>_> *)
             &stack0xffffffffffffffd0);
  *(int *)&((this_00._M_head_impl)->selector).tag = other_sheet->specificity_offset;
  robin_hood::detail::
  Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Keyframes,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=((Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Keyframes,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&(this_00._M_head_impl)->selector + 8),&other_sheet->keyframes);
  robin_hood::detail::
  Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::NamedDecorator,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=((Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::NamedDecorator,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&(this_00._M_head_impl)->selector + 0x38),&other_sheet->named_decorator_map)
  ;
  SpritesheetList::operator=
            ((SpritesheetList *)((long)&(this_00._M_head_impl)->selector + 0x68),
             &other_sheet->spritesheet_list);
  MergeStyleSheet((StyleSheet *)this_00._M_head_impl,in_RDX);
  return (__uniq_ptr_data<Rml::StyleSheet,_std::default_delete<Rml::StyleSheet>,_true,_true>)
         (__uniq_ptr_data<Rml::StyleSheet,_std::default_delete<Rml::StyleSheet>,_true,_true>)this;
}

Assistant:

UniquePtr<StyleSheet> StyleSheet::CombineStyleSheet(const StyleSheet& other_sheet) const
{
	RMLUI_ZoneScoped;

	UniquePtr<StyleSheet> new_sheet = UniquePtr<StyleSheet>(new StyleSheet());

	new_sheet->root = root->DeepCopy();
	new_sheet->specificity_offset = specificity_offset;
	new_sheet->keyframes = keyframes;
	new_sheet->named_decorator_map = named_decorator_map;
	new_sheet->spritesheet_list = spritesheet_list;

	new_sheet->MergeStyleSheet(other_sheet);

	return new_sheet;
}